

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall FIX::Message::validate(Message *this)

{
  int iVar1;
  ostream *poVar2;
  InvalidMessage *pIVar3;
  string fieldName_1;
  FieldNotFound *e;
  string fieldName;
  IncorrectDataFormat *e_1;
  string local_3a0;
  stringstream local_380 [8];
  stringstream text_1;
  ostream local_370 [376];
  int local_1f8;
  int local_1f4;
  int receivedChecksum;
  int expectedChecksum;
  CheckSum *aCheckSum;
  string local_1e0;
  stringstream local_1c0 [8];
  stringstream text;
  ostream local_1b0 [376];
  ulong local_38;
  size_t receivedLength;
  size_t expectedLength;
  FieldBase *local_18;
  BodyLength *aBodyLength;
  Message *this_local;
  
  aBodyLength = (BodyLength *)this;
  local_18 = FieldMap::getFieldRef(&(this->m_header).super_FieldMap,9);
  iVar1 = IntField::operator_cast_to_int((IntField *)local_18);
  receivedLength = (size_t)iVar1;
  iVar1 = bodyLength(this,8,9,10);
  local_38 = (ulong)iVar1;
  if (receivedLength != local_38) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar2 = std::operator<<(local_1b0,"Expected BodyLength=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,receivedLength);
    poVar2 = std::operator<<(poVar2,", Received BodyLength=");
    std::ostream::operator<<(poVar2,local_38);
    aCheckSum._7_1_ = 1;
    pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::stringstream::str();
    InvalidMessage::InvalidMessage(pIVar3,&local_1e0);
    aCheckSum._7_1_ = 0;
    __cxa_throw(pIVar3,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
  }
  _receivedChecksum = FieldMap::getFieldRef(&(this->m_trailer).super_FieldMap,10);
  local_1f4 = CheckSumField::operator_cast_to_int((CheckSumField *)_receivedChecksum);
  local_1f8 = checkSum(this,10);
  if (local_1f4 != local_1f8) {
    std::__cxx11::stringstream::stringstream(local_380);
    poVar2 = std::operator<<(local_370,"Expected CheckSum=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1f4);
    poVar2 = std::operator<<(poVar2,", Received CheckSum=");
    std::ostream::operator<<(poVar2,local_1f8);
    pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::__cxx11::stringstream::str();
    InvalidMessage::InvalidMessage(pIVar3,&local_3a0);
    __cxa_throw(pIVar3,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
  }
  return;
}

Assistant:

void Message::validate() const {
  try {
    const BodyLength &aBodyLength = FIELD_GET_REF(m_header, BodyLength);

    const size_t expectedLength = static_cast<size_t>(aBodyLength);
    const size_t receivedLength = bodyLength();

    if (expectedLength != receivedLength) {
      std::stringstream text;
      text << "Expected BodyLength=" << expectedLength << ", Received BodyLength=" << receivedLength;
      throw InvalidMessage(text.str());
    }

    const CheckSum &aCheckSum = FIELD_GET_REF(m_trailer, CheckSum);

    const int expectedChecksum = (int)aCheckSum;
    const int receivedChecksum = checkSum();

    if (expectedChecksum != receivedChecksum) {
      std::stringstream text;
      text << "Expected CheckSum=" << expectedChecksum << ", Received CheckSum=" << receivedChecksum;
      throw InvalidMessage(text.str());
    }
  } catch (FieldNotFound &e) {
    const std::string fieldName = (e.field == FIX::FIELD::BodyLength) ? "BodyLength" : "CheckSum";
    throw InvalidMessage(fieldName + std::string(" is missing"));
  } catch (IncorrectDataFormat &e) {
    const std::string fieldName = (e.field == FIX::FIELD::BodyLength) ? "BodyLength" : "CheckSum";
    throw InvalidMessage(fieldName + std::string(" has wrong format: ") + e.detail);
  }
}